

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,TypeVector *expected)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  Result RVar4;
  Result RVar5;
  Result RVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  Type TVar10;
  Type in_stack_ffffffffffffffb8;
  Type type2;
  Type type1;
  
  type1.enum_ = Any;
  type1.type_index_ = 0xffffffff;
  type2.enum_ = Any;
  type2.type_index_ = 0xffffffff;
  RVar4 = PeekAndCheckType(this,0,(Type)0xffffffffffffffff);
  RVar5 = PeekType(this,1,&type1);
  RVar6 = PeekType(this,2,&type2);
  TVar10 = type1;
  bVar7 = RVar6.enum_ == Error || (RVar5.enum_ == Error || RVar4.enum_ == Error);
  pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar1 == pTVar2) {
    bVar3 = true;
    if (((5 < (uint)(type1.enum_ + 0x15)) || ((0x31U >> (type1.enum_ + 0x15 & 0x1fU) & 1) == 0)) &&
       ((5 < (uint)(type2.enum_ + 0x15) || ((0x31U >> (type2.enum_ + 0x15 & 0x1fU) & 1) == 0)))) {
      RVar4 = CheckType(in_stack_ffffffffffffffb8,(Type)0x16dca9);
      bVar3 = bVar7 || RVar4.enum_ == Error;
      uVar8 = (ulong)TVar10 & 0xffffffff00000000;
      uVar9 = (ulong)TVar10 & 0xffffffff;
      goto LAB_0016dc31;
    }
  }
  else {
    if ((long)pTVar2 - (long)pTVar1 != 8) {
      __assert_fail("expected.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/type-checker.cc"
                    ,0x356,"Result wabt::TypeChecker::OnSelect(const TypeVector &)");
    }
    RVar4 = CheckType(in_stack_ffffffffffffffb8,(Type)0x16dbea);
    RVar5 = CheckType(in_stack_ffffffffffffffb8,(Type)0x16dc03);
    bVar3 = RVar5.enum_ == Error || (bVar7 || RVar4.enum_ == Error);
  }
  uVar8 = 0xffffffff00000000;
  uVar9 = 0;
LAB_0016dc31:
  TVar10 = (Type)(uVar9 | uVar8);
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = bVar3;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>(this,RVar4,"select",TVar10,TVar10,I32);
  RVar4 = DropTypes(this,3);
  PushType(this,TVar10);
  return (Result)(uint)(byte)(bVar3 | RVar4.enum_ == Error);
}

Assistant:

Result TypeChecker::OnSelect(const TypeVector& expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected.empty()) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    assert(expected.size() == 1);
    result |= CheckType(type1, expected[0]);
    result |= CheckType(type2, expected[0]);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}